

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswMan.c
# Opt level: O3

Csw_Man_t * Csw_ManStart(Aig_Man_t *pMan,int nCutsMax,int nLeafMax,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  uint uVar4;
  Csw_Man_t *pCVar5;
  Aig_Man_t *pAVar6;
  int *piVar7;
  Aig_Obj_t **ppAVar8;
  Csw_Cut_t **ppCVar9;
  Aig_MmFixed_t *pAVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  size_t __size;
  
  if (nCutsMax < 2) {
    __assert_fail("nCutsMax >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswMan.c"
                  ,0x32,"Csw_Man_t *Csw_ManStart(Aig_Man_t *, int, int, int)");
  }
  if (0x10 < nLeafMax) {
    __assert_fail("nLeafMax <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswMan.c"
                  ,0x33,"Csw_Man_t *Csw_ManStart(Aig_Man_t *, int, int, int)");
  }
  pCVar5 = (Csw_Man_t *)calloc(1,0xa8);
  pCVar5->nCutsMax = nCutsMax;
  pCVar5->nLeafMax = nLeafMax;
  pCVar5->fVerbose = fVerbose;
  pCVar5->pManAig = pMan;
  pAVar6 = Aig_ManStartFrom(pMan);
  pCVar5->pManRes = pAVar6;
  if (pMan->nObjs[2] != pAVar6->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(p->pManAig) == Aig_ManCiNum(p->pManRes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswMan.c"
                  ,0x3d,"Csw_Man_t *Csw_ManStart(Aig_Man_t *, int, int, int)");
  }
  lVar16 = (long)pMan->vObjs->nSize;
  piVar7 = (int *)calloc(1,lVar16 * 4);
  pCVar5->pnRefs = piVar7;
  __size = lVar16 << 3;
  ppAVar8 = (Aig_Obj_t **)malloc(__size);
  pCVar5->pEquiv = ppAVar8;
  ppCVar9 = (Csw_Cut_t **)calloc(1,__size);
  pCVar5->pCuts = ppCVar9;
  uVar3 = 1 << ((char)nLeafMax - 5U & 0x1f);
  if (nLeafMax < 6) {
    uVar3 = 1;
  }
  pCVar5->nTruthWords = uVar3;
  iVar14 = (nLeafMax + uVar3) * 4 + 0x18;
  pCVar5->nCutSize = iVar14;
  pAVar10 = Aig_MmFixedStart(iVar14 * nCutsMax,0x200);
  pCVar5->pMemCuts = pAVar10;
  uVar12 = ((pMan->nObjs[6] + pMan->nObjs[5]) * nCutsMax) / 2 - 1;
  while( true ) {
    do {
      uVar13 = uVar12 + 1;
      uVar4 = uVar12 & 1;
      uVar12 = uVar13;
    } while (uVar4 != 0);
    if (uVar13 < 9) break;
    iVar14 = 5;
    while (uVar13 % (iVar14 - 2U) != 0) {
      uVar4 = iVar14 * iVar14;
      iVar14 = iVar14 + 2;
      if (uVar13 < uVar4) goto LAB_004f0c76;
    }
  }
LAB_004f0c76:
  pCVar5->nTableSize = uVar13;
  ppCVar9 = (Csw_Cut_t **)calloc(1,(long)(int)uVar13 << 3);
  pCVar5->pTable = ppCVar9;
  ppAVar8[pMan->pConst1->Id] = pAVar6->pConst1;
  pVVar1 = pMan->vCis;
  lVar16 = (long)pVVar1->nSize;
  if (0 < lVar16) {
    pVVar2 = pAVar6->vCis;
    iVar14 = pVVar2->nSize;
    lVar15 = 0;
    do {
      if (iVar14 <= lVar15) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppAVar8[*(int *)((long)pVVar1->pArray[lVar15] + 0x24)] = (Aig_Obj_t *)pVVar2->pArray[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar16 != lVar15);
  }
  puVar11 = (uint *)malloc((ulong)(uVar3 * 4) << 2);
  pCVar5->puTemp[0] = puVar11;
  puVar11 = puVar11 + uVar3;
  pCVar5->puTemp[1] = puVar11;
  pCVar5->puTemp[2] = puVar11 + uVar3;
  pCVar5->puTemp[3] = puVar11 + uVar3 + uVar3;
  return pCVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the cut sweeping manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Csw_Man_t * Csw_ManStart( Aig_Man_t * pMan, int nCutsMax, int nLeafMax, int fVerbose )
{
    Csw_Man_t * p;
    Aig_Obj_t * pObj;
    int i;
    assert( nCutsMax >= 2  );
    assert( nLeafMax <= 16 );
    // allocate the fraiging manager
    p = ABC_ALLOC( Csw_Man_t, 1 );
    memset( p, 0, sizeof(Csw_Man_t) );
    p->nCutsMax = nCutsMax;
    p->nLeafMax = nLeafMax;
    p->fVerbose = fVerbose;
    p->pManAig  = pMan;
    // create the new manager
    p->pManRes  = Aig_ManStartFrom( pMan );
    assert( Aig_ManCiNum(p->pManAig) == Aig_ManCiNum(p->pManRes) );
    // allocate room for cuts and equivalent nodes
    p->pnRefs   = ABC_ALLOC( int, Aig_ManObjNumMax(pMan) );
    p->pEquiv   = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pMan) );
    p->pCuts    = ABC_ALLOC( Csw_Cut_t *, Aig_ManObjNumMax(pMan) );
    memset( p->pCuts, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(pMan) );
    memset( p->pnRefs, 0, sizeof(int) * Aig_ManObjNumMax(pMan) );
    // allocate memory manager
    p->nTruthWords = Abc_TruthWordNum(nLeafMax);
    p->nCutSize = sizeof(Csw_Cut_t) + sizeof(int) * nLeafMax + sizeof(unsigned) * p->nTruthWords;
    p->pMemCuts = Aig_MmFixedStart( p->nCutSize * p->nCutsMax, 512 );
    // allocate hash table for cuts
    p->nTableSize = Abc_PrimeCudd( Aig_ManNodeNum(pMan) * p->nCutsMax / 2 );
    p->pTable = ABC_ALLOC( Csw_Cut_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Aig_Obj_t *) * p->nTableSize );
    // set the pointers to the available fraig nodes
    Csw_ObjSetEquiv( p, Aig_ManConst1(p->pManAig), Aig_ManConst1(p->pManRes) );
    Aig_ManForEachCi( p->pManAig, pObj, i )
        Csw_ObjSetEquiv( p, pObj, Aig_ManCi(p->pManRes, i) );
    // room for temporary truth tables
    p->puTemp[0] = ABC_ALLOC( unsigned, 4 * p->nTruthWords );
    p->puTemp[1] = p->puTemp[0] + p->nTruthWords;
    p->puTemp[2] = p->puTemp[1] + p->nTruthWords;
    p->puTemp[3] = p->puTemp[2] + p->nTruthWords;
    return p;
}